

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecmath.h
# Opt level: O2

bool __thiscall
pbrt::Bounds3<float>::IntersectP
          (Bounds3<float> *this,Point3f *o,Vector3f *d,Float tMax,Float *hitt0,Float *hitt1)

{
  undefined1 auVar1 [16];
  uint uVar2;
  uint uVar3;
  Point3<float> *pPVar4;
  float *pfVar5;
  undefined1 in_register_00001204 [60];
  undefined1 auVar6 [64];
  float fVar7;
  float fVar8;
  float fVar9;
  undefined1 auVar10 [16];
  float fVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  
  auVar6._4_60_ = in_register_00001204;
  auVar6._0_4_ = tMax;
  fVar7 = 1.0 / (d->super_Tuple3<pbrt::Vector3,_float>).y;
  fVar8 = 1.0 / (d->super_Tuple3<pbrt::Vector3,_float>).x;
  fVar9 = 1.0 / (d->super_Tuple3<pbrt::Vector3,_float>).z;
  auVar10._0_12_ = ZEXT812(0);
  auVar10._12_4_ = 0;
  uVar2 = 0;
  do {
    uVar3 = uVar2;
    auVar13 = ZEXT416((uint)(fVar8 * ((this->pMin).super_Tuple3<pbrt::Point3,_float>.x -
                                     (o->super_Tuple3<pbrt::Point3,_float>).x)));
    pPVar4 = &this->pMax;
    pfVar5 = (float *)o;
    fVar11 = fVar8;
    if ((uVar3 != 0) &&
       (auVar13 = ZEXT416((uint)(fVar7 * ((this->pMin).super_Tuple3<pbrt::Point3,_float>.y -
                                         (o->super_Tuple3<pbrt::Point3,_float>).y))),
       pPVar4 = (Point3<float> *)&(this->pMax).super_Tuple3<pbrt::Point3,_float>.y,
       pfVar5 = &(o->super_Tuple3<pbrt::Point3,_float>).y, fVar11 = fVar7, uVar3 != 1)) {
      if (uVar3 == 3) {
        if (hitt0 != (Float *)0x0) {
          *hitt0 = auVar10._0_4_;
        }
        if (hitt1 != (Float *)0x0) {
          *hitt1 = auVar6._0_4_;
        }
        break;
      }
      auVar13 = ZEXT416((uint)(fVar9 * ((this->pMin).super_Tuple3<pbrt::Point3,_float>.z -
                                       (o->super_Tuple3<pbrt::Point3,_float>).z)));
      pPVar4 = (Point3<float> *)&(this->pMax).super_Tuple3<pbrt::Point3,_float>.z;
      pfVar5 = &(o->super_Tuple3<pbrt::Point3,_float>).z;
      fVar11 = fVar9;
    }
    auVar12 = ZEXT416((uint)(fVar11 * ((pPVar4->super_Tuple3<pbrt::Point3,_float>).x - *pfVar5)));
    auVar1 = vminss_avx(auVar12,auVar13);
    auVar13 = vmaxss_avx(auVar13,auVar12);
    auVar10 = vmaxss_avx(auVar1,auVar10);
    auVar13 = vminss_avx(ZEXT416((uint)(auVar13._0_4_ * 1.0000004)),auVar6._0_16_);
    auVar6 = ZEXT1664(auVar13);
    uVar2 = uVar3 + 1;
  } while (auVar10._0_4_ <= auVar13._0_4_);
  return 2 < uVar3;
}

Assistant:

PBRT_CPU_GPU inline bool Bounds3<T>::IntersectP(const Point3f &o, const Vector3f &d,
                                                Float tMax, Float *hitt0,
                                                Float *hitt1) const {
    Float t0 = 0, t1 = tMax;
    for (int i = 0; i < 3; ++i) {
        // Update interval for _i_th bounding box slab
        Float invRayDir = 1 / d[i];
        Float tNear = (pMin[i] - o[i]) * invRayDir;
        Float tFar = (pMax[i] - o[i]) * invRayDir;
        // Update parametric interval from slab intersection $t$ values
        if (tNear > tFar)
            pstd::swap(tNear, tFar);
        // Update _tFar_ to ensure robust ray--bounds intersection
        tFar *= 1 + 2 * gamma(3);

        t0 = tNear > t0 ? tNear : t0;
        t1 = tFar < t1 ? tFar : t1;
        if (t0 > t1)
            return false;
    }
    if (hitt0)
        *hitt0 = t0;
    if (hitt1)
        *hitt1 = t1;
    return true;
}